

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_postencode_drop_cbr(AV1_COMP *cpi,size_t *size)

{
  long lVar1;
  long *in_RSI;
  long *in_RDI;
  PRIMARY_RATE_CONTROL *lp_rc;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  int layer;
  int tl;
  int sl;
  SVC *svc;
  int64_t buffer_thresh;
  int qp_thresh;
  int64_t new_buffer_level;
  size_t frame_size;
  PRIMARY_RATE_CONTROL *p_rc;
  int local_50;
  int local_4c;
  int local_4;
  
  lVar1 = *in_RDI;
  if (((((int)in_RDI[0xc0f6] == 0) &&
       (*(long *)(lVar1 + 0xad38) + (long)*(int *)((long)in_RDI + 0x607f4) + *in_RSI * -8 <
        *(long *)(lVar1 + 0xac78) >> 2)) &&
      ((ulong)(uint)(*(int *)((long)in_RDI + 0x607f4) << 3) < (ulong)(*in_RSI * 8))) &&
     ((int)in_RDI[0x783d] < (*(int *)((long)in_RDI + 0x6082c) >> 2) * 3)) {
    *in_RSI = 0;
    *(undefined1 *)(in_RDI + 0x13ac2) = 1;
    restore_all_coding_context((AV1_COMP *)0x2cd568);
    av1_rc_postencode_update_drop_frame((AV1_COMP *)0x2cd572);
    *(undefined4 *)(in_RDI + 0xc104) = 1;
    *(undefined4 *)(lVar1 + 0xacc0) = *(undefined4 *)((long)in_RDI + 0x6082c);
    *(undefined8 *)(lVar1 + 0xad38) = *(undefined8 *)(lVar1 + 0xac78);
    *(undefined8 *)(lVar1 + 0xad58) = *(undefined8 *)(lVar1 + 0xac78);
    *(undefined4 *)((long)in_RDI + 0x60834) = 0;
    *(undefined4 *)(in_RDI + 0xc107) = 0;
    if ((1 < (int)in_RDI[0x13a67]) || (1 < *(int *)((long)in_RDI + 0x9d33c))) {
      for (local_4c = 0; local_4c < (int)in_RDI[0x13a67]; local_4c = local_4c + 1) {
        for (local_50 = 0; local_50 < *(int *)((long)in_RDI + 0x9d33c); local_50 = local_50 + 1) {
          lVar1 = in_RDI[0x13a91] +
                  (long)(local_4c * *(int *)((long)in_RDI + 0x9d33c) + local_50) * 0x3380;
          *(undefined4 *)(lVar1 + 0xb0) = 1;
          *(undefined4 *)(lVar1 + 0x22d0) = *(undefined4 *)((long)in_RDI + 0x6082c);
          *(undefined8 *)(lVar1 + 0x2348) = *(undefined8 *)(lVar1 + 0x2288);
          *(undefined8 *)(lVar1 + 0x2368) = *(undefined8 *)(lVar1 + 0x2288);
          *(undefined4 *)(lVar1 + 0xc4) = 0;
          *(undefined4 *)(lVar1 + 200) = 0;
        }
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_postencode_drop_cbr(AV1_COMP *cpi, size_t *size) {
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  size_t frame_size = *size << 3;
  const int64_t new_buffer_level =
      p_rc->buffer_level + cpi->rc.avg_frame_bandwidth - (int64_t)frame_size;
  // Drop if new buffer level (given the encoded frame size) goes below a
  // threshold and encoded frame size is much larger than per-frame-bandwidth.
  // If the frame is already labelled as scene change (high_source_sad = 1)
  // or the QP is close to max, then no need to drop.
  const int qp_thresh = 3 * (cpi->rc.worst_quality >> 2);
  const int64_t buffer_thresh = p_rc->optimal_buffer_level >> 2;
  if (!cpi->rc.high_source_sad && new_buffer_level < buffer_thresh &&
      frame_size > 8 * (unsigned int)cpi->rc.avg_frame_bandwidth &&
      cpi->common.quant_params.base_qindex < qp_thresh) {
    *size = 0;
    cpi->is_dropped_frame = true;
    restore_all_coding_context(cpi);
    av1_rc_postencode_update_drop_frame(cpi);
    // Force max_q on next fame. Reset some RC parameters.
    cpi->rc.force_max_q = 1;
    p_rc->avg_frame_qindex[INTER_FRAME] = cpi->rc.worst_quality;
    p_rc->buffer_level = p_rc->optimal_buffer_level;
    p_rc->bits_off_target = p_rc->optimal_buffer_level;
    cpi->rc.rc_1_frame = 0;
    cpi->rc.rc_2_frame = 0;
    if (cpi->svc.number_spatial_layers > 1 ||
        cpi->svc.number_temporal_layers > 1) {
      SVC *svc = &cpi->svc;
      // Postencode drop is only checked on base spatial layer,
      // for now if max-q is set on base we force it on all layers.
      for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
        for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
          const int layer =
              LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
          LAYER_CONTEXT *lc = &svc->layer_context[layer];
          RATE_CONTROL *lrc = &lc->rc;
          PRIMARY_RATE_CONTROL *lp_rc = &lc->p_rc;
          // Force max_q on next fame. Reset some RC parameters.
          lrc->force_max_q = 1;
          lp_rc->avg_frame_qindex[INTER_FRAME] = cpi->rc.worst_quality;
          lp_rc->buffer_level = lp_rc->optimal_buffer_level;
          lp_rc->bits_off_target = lp_rc->optimal_buffer_level;
          lrc->rc_1_frame = 0;
          lrc->rc_2_frame = 0;
        }
      }
    }
    return 1;
  }
  return 0;
}